

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayer.cpp
# Opt level: O3

void __thiscall
nanoNet::NeuralNetworkLayer::NeuralNetworkLayer
          (NeuralNetworkLayer *this,size_t inputCount,size_t outputCount,
          ActivationFunction *activationFunction)

{
  size_type __n;
  pointer pfVar1;
  pointer pvVar2;
  unsigned_long __res;
  ulong uVar3;
  long lVar4;
  float *value;
  pointer pfVar5;
  pointer pvVar6;
  float *value_1;
  float fVar7;
  matrix_type *__range1_1;
  vector_type *__range1;
  mt19937 rng;
  allocator_type local_13ca;
  allocator_type local_13c9;
  matrix_type *local_13c8;
  vector_type *local_13c0;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  this->m_inputCount = inputCount;
  this->m_outputCount = outputCount;
  (this->m_activationFunction).m_option = activationFunction->m_option;
  local_13c0 = &this->m_biases;
  std::vector<float,_std::allocator<float>_>::vector
            (local_13c0,outputCount,(allocator_type *)&local_13b8);
  __n = this->m_outputCount;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_13b8,this->m_inputCount,&local_13c9);
  local_13c8 = &this->m_weights;
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(local_13c8,__n,(value_type *)&local_13b8,&local_13ca);
  if ((void *)local_13b8._M_x[0] != (void *)0x0) {
    operator_delete((void *)local_13b8._M_x[0],local_13b8._M_x[2] - local_13b8._M_x[0]);
  }
  local_13b8._M_x[0] = time((time_t *)0x0);
  local_13b8._M_x[0] = local_13b8._M_x[0] & 0xffffffff;
  lVar4 = 1;
  uVar3 = local_13b8._M_x[0];
  do {
    uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar4);
    local_13b8._M_x[lVar4] = uVar3;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x270);
  local_13b8._M_p = 0x270;
  pfVar5 = (this->m_biases).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar1 = (this->m_biases).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pfVar5 != pfVar1) {
    do {
      fVar7 = std::
              generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        (&local_13b8);
      *pfVar5 = fVar7 + fVar7 + -1.0;
      pfVar5 = pfVar5 + 1;
    } while (pfVar5 != pfVar1);
  }
  pvVar6 = (this->m_weights).
           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (this->m_weights).
           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar6 != pvVar2) {
    do {
      pfVar1 = (pvVar6->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (pfVar5 = (pvVar6->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_start; pfVar5 != pfVar1; pfVar5 = pfVar5 + 1) {
        fVar7 = std::
                generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                          (&local_13b8);
        *pfVar5 = fVar7 + fVar7 + -1.0;
      }
      pvVar6 = pvVar6 + 1;
    } while (pvVar6 != pvVar2);
  }
  return;
}

Assistant:

NeuralNetworkLayer::NeuralNetworkLayer(std::size_t inputCount, std::size_t outputCount,
    const ActivationFunction& activationFunction)
    : m_inputCount(inputCount)
    , m_outputCount(outputCount)
    , m_activationFunction(activationFunction)
    , m_biases(m_outputCount)
    , m_weights(m_outputCount, vector_type(m_inputCount))
{
    std::mt19937 rng(std::time(NULL));
    std::uniform_real_distribution<float> uniform(-1.0f, 1.0f);

    for (auto& value : m_biases)
        value = uniform(rng);

    for (auto& values : m_weights)
        for (auto& value : values)
            value = uniform(rng);
}